

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcheckbox.cpp
# Opt level: O0

bool __thiscall QCheckBox::event(QCheckBox *this,QEvent *e)

{
  bool bVar1;
  Type TVar2;
  QEvent *in_RSI;
  QStyleOption *in_RDI;
  SubElement unaff_retaddr;
  QWidgetPrivate *in_stack_00000008;
  QCheckBoxPrivate *d;
  
  d_func((QCheckBox *)0x52e4d1);
  TVar2 = QEvent::type(in_RSI);
  if (TVar2 == StyleChange) {
    QWidgetPrivate::setLayoutItemMargins(in_stack_00000008,unaff_retaddr,in_RDI);
  }
  bVar1 = QAbstractButton::event((QAbstractButton *)in_RDI,in_RSI);
  return bVar1;
}

Assistant:

bool QCheckBox::event(QEvent *e)
{
    Q_D(QCheckBox);
    if (e->type() == QEvent::StyleChange
#ifdef Q_OS_MAC
            || e->type() == QEvent::MacSizeChange
#endif
            )
        d->setLayoutItemMargins(QStyle::SE_CheckBoxLayoutItem);
    return QAbstractButton::event(e);
}